

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cc
# Opt level: O2

void Log::set_level(Level _level)

{
  level = _level;
  Verbose.stream = stream;
  if ((int)Verbose.level < (int)_level) {
    Verbose.stream = (ostream *)Logger::dummy;
  }
  Debug.stream = stream;
  if ((int)Debug.level < (int)_level) {
    Debug.stream = (ostream *)Logger::dummy;
  }
  Info.stream = stream;
  if ((int)Info.level < (int)_level) {
    Info.stream = (ostream *)Logger::dummy;
  }
  Warn.stream = stream;
  if ((int)Warn.level < (int)_level) {
    Warn.stream = (ostream *)Logger::dummy;
  }
  Error.stream = stream;
  if ((int)Error.level < (int)_level) {
    Error.stream = (ostream *)Logger::dummy;
  }
  return;
}

Assistant:

void
Log::set_level(Log::Level _level) {
  level = _level;
  Verbose.apply_level();
  Debug.apply_level();
  Info.apply_level();
  Warn.apply_level();
  Error.apply_level();
}